

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_PhaseGenerate(ym3438_t *chip)

{
  uint uVar1;
  Bit32u slot;
  ym3438_t *chip_local;
  
  uVar1 = (chip->cycles + 0x14) % 0x18;
  if (chip->pg_reset[uVar1] != '\0') {
    chip->pg_inc[uVar1] = 0;
  }
  uVar1 = (chip->cycles + 0x13) % 0x18;
  chip->pg_phase[uVar1] = chip->pg_inc[uVar1] + chip->pg_phase[uVar1];
  chip->pg_phase[uVar1] = chip->pg_phase[uVar1] & 0xfffff;
  if ((chip->pg_reset[uVar1] != '\0') || (chip->mode_test_21[3] != '\0')) {
    chip->pg_phase[uVar1] = 0;
  }
  return;
}

Assistant:

void OPN2_PhaseGenerate(ym3438_t *chip)
{
    Bit32u slot;
    /* Mask increment */
    slot = (chip->cycles + 20) % 24;
    if (chip->pg_reset[slot])
    {
        chip->pg_inc[slot] = 0;
    }
    /* Phase step */
    slot = (chip->cycles + 19) % 24;
    chip->pg_phase[slot] += chip->pg_inc[slot];
    chip->pg_phase[slot] &= 0xfffff;
    if (chip->pg_reset[slot] || chip->mode_test_21[3])
    {
        chip->pg_phase[slot] = 0;
    }
}